

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests.cpp
# Opt level: O2

void __thiscall
HecrSequential_cyclicReductionExtendedMatrix_Test::TestBody
          (HecrSequential_cyclicReductionExtendedMatrix_Test *this)

{
  long lVar1;
  long lVar2;
  double *pdVar3;
  double *pdVar4;
  char *message;
  byte bVar5;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_388;
  AssertHelper local_380;
  AssertionResult gtest_ar;
  vec solution;
  vec xs;
  vec rhs;
  vec cs;
  vec bs;
  vec as;
  TridiagonalMatrix m;
  double xs_values [15];
  double rhs_values [15];
  double cs_values [15];
  double bs_values [15];
  double as_values [15];
  
  bVar5 = 0;
  lVar2 = 0xf;
  pdVar3 = (double *)&DAT_0013f510;
  pdVar4 = as_values;
  for (lVar1 = lVar2; lVar1 != 0; lVar1 = lVar1 + -1) {
    *pdVar4 = *pdVar3;
    pdVar3 = pdVar3 + 1;
    pdVar4 = pdVar4 + 1;
  }
  make_vector(&as,0xf,as_values);
  pdVar3 = (double *)&DAT_0013f590;
  pdVar4 = bs_values;
  for (; lVar2 != 0; lVar2 = lVar2 + -1) {
    *pdVar4 = *pdVar3;
    pdVar3 = pdVar3 + (ulong)bVar5 * -2 + 1;
    pdVar4 = pdVar4 + (ulong)bVar5 * -2 + 1;
  }
  make_vector(&bs,0xf,bs_values);
  pdVar3 = (double *)&DAT_0013f610;
  pdVar4 = cs_values;
  for (lVar2 = 0xf; lVar2 != 0; lVar2 = lVar2 + -1) {
    *pdVar4 = *pdVar3;
    pdVar3 = pdVar3 + (ulong)bVar5 * -2 + 1;
    pdVar4 = pdVar4 + (ulong)bVar5 * -2 + 1;
  }
  make_vector(&cs,0xf,cs_values);
  TridiagonalMatrix::TridiagonalMatrix(&m,&as,&bs,&cs);
  pdVar3 = (double *)&DAT_0013f690;
  pdVar4 = rhs_values;
  for (lVar2 = 0xf; lVar2 != 0; lVar2 = lVar2 + -1) {
    *pdVar4 = *pdVar3;
    pdVar3 = pdVar3 + (ulong)bVar5 * -2 + 1;
    pdVar4 = pdVar4 + (ulong)bVar5 * -2 + 1;
  }
  make_vector(&rhs,0xf,rhs_values);
  pdVar3 = (double *)&DAT_0013f710;
  pdVar4 = xs_values;
  for (lVar2 = 0xf; lVar2 != 0; lVar2 = lVar2 + -1) {
    *pdVar4 = *pdVar3;
    pdVar3 = pdVar3 + (ulong)bVar5 * -2 + 1;
    pdVar4 = pdVar4 + (ulong)bVar5 * -2 + 1;
  }
  make_vector(&xs,0xf,xs_values);
  cyclic_reduction(&solution,&m,&rhs);
  local_388.ptr_ =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
       max_diff(&xs,&solution);
  testing::internal::CmpHelperLT<double,double>
            ((internal *)&gtest_ar,"max_diff(xs, solution)","EPS",(double *)&local_388,&EPS);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_388);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      message = "";
    }
    else {
      message = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_380,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/antonlarin[P]hecr/common/tests.cpp"
               ,0x92,message);
    testing::internal::AssertHelper::operator=(&local_380,(Message *)&local_388);
    testing::internal::AssertHelper::~AssertHelper(&local_380);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr(&local_388);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            (&solution.super__Vector_base<double,_std::allocator<double>_>);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            (&xs.super__Vector_base<double,_std::allocator<double>_>);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            (&rhs.super__Vector_base<double,_std::allocator<double>_>);
  TridiagonalMatrix::~TridiagonalMatrix(&m);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            (&cs.super__Vector_base<double,_std::allocator<double>_>);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            (&bs.super__Vector_base<double,_std::allocator<double>_>);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            (&as.super__Vector_base<double,_std::allocator<double>_>);
  return;
}

Assistant:

TEST(HecrSequential, cyclicReductionExtendedMatrix)
{
    int size = 15;
    const double as_values[] = { 3, 4, 3, 7, 5.5, -6, 4, -1, 3,
        1, 1, 1, 1, 1, 1 };
    vec as = make_vector(size, as_values);
    const double bs_values[] = { 0, -1, 2, 1.1, 3.2, 2, 1, -0.3, -2,
        0, 0, 0, 0, 0, 0 };
    vec bs = make_vector(size, bs_values);
    const double cs_values[] = { 2, 0.5, -0.7, 1, 0.8, 1, 0.2, 0.5, 0,
        0, 0, 0, 0, 0, 0 };
    vec cs = make_vector(size, cs_values);
    TridiagonalMatrix m(as, bs, cs);
    const double rhs_values[] = { 7, 6.5, 1, 0.9, 8.6, 26, 12.6, 0.3, 1,
        0, 0, 0, 0, 0, 0 };
    vec rhs = make_vector(size, rhs_values);
    const double xs_values[] = { 1, 2, -1, 0, 2, -3, 4, -2, -1,
        0, 0, 0, 0, 0, 0 };
    vec xs = make_vector(size, xs_values);

    vec solution = cyclic_reduction(m, rhs);

    EXPECT_LT(max_diff(xs, solution), EPS);
}